

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Molecules.cpp
# Opt level: O0

void __thiscall Molecules::Display(Molecules *this)

{
  bool bVar1;
  pointer ppVar2;
  ostream *poVar3;
  size_type sVar4;
  string local_40;
  _Node_iterator_base<std::pair<const_unsigned_long,_Molecule>,_false> local_20;
  _Node_iterator_base<std::pair<const_unsigned_long,_Molecule>,_false> local_18;
  iterator it;
  Molecules *this_local;
  
  it.super__Node_iterator_base<std::pair<const_unsigned_long,_Molecule>,_false>._M_cur =
       (_Node_iterator_base<std::pair<const_unsigned_long,_Molecule>,_false>)
       (_Node_iterator_base<std::pair<const_unsigned_long,_Molecule>,_false>)this;
  local_18._M_cur =
       (__node_type *)
       std::
       unordered_map<unsigned_long,_Molecule,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_Molecule>_>_>
       ::begin(&this->molecules);
  while( true ) {
    local_20._M_cur =
         (__node_type *)
         std::
         unordered_map<unsigned_long,_Molecule,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_Molecule>_>_>
         ::end(&this->molecules);
    bVar1 = std::__detail::operator!=(&local_18,&local_20);
    if (!bVar1) break;
    ppVar2 = std::__detail::_Node_iterator<std::pair<const_unsigned_long,_Molecule>,_false,_false>::
             operator->((_Node_iterator<std::pair<const_unsigned_long,_Molecule>,_false,_false> *)
                        &local_18);
    poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,ppVar2->first);
    poVar3 = std::operator<<(poVar3,"\t");
    ppVar2 = std::__detail::_Node_iterator<std::pair<const_unsigned_long,_Molecule>,_false,_false>::
             operator->((_Node_iterator<std::pair<const_unsigned_long,_Molecule>,_false,_false> *)
                        &local_18);
    KeyManager::Get_abi_cxx11_(&local_40,(KeyManager *)diplo::KM,ppVar2->first);
    poVar3 = std::operator<<(poVar3,(string *)&local_40);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string((string *)&local_40);
    ppVar2 = std::__detail::_Node_iterator<std::pair<const_unsigned_long,_Molecule>,_false,_false>::
             operator->((_Node_iterator<std::pair<const_unsigned_long,_Molecule>,_false,_false> *)
                        &local_18);
    Molecule::Display(&ppVar2->second);
    std::__detail::_Node_iterator<std::pair<const_unsigned_long,_Molecule>,_false,_false>::
    operator++((_Node_iterator<std::pair<const_unsigned_long,_Molecule>,_false,_false> *)&local_18,0
              );
  }
  poVar3 = (ostream *)
           std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
  poVar3 = std::operator<<(poVar3,"Number of molecules: ");
  sVar4 = std::
          unordered_map<unsigned_long,_Molecule,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_Molecule>_>_>
          ::size(&this->molecules);
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,sVar4);
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void Molecules::Display() {

	for (unordered_map<KEY_ID, Molecule >::iterator it = molecules.begin(); it != molecules.end(); it++) {
			cout << it->first << "\t" << diplo::KM.Get(it->first )<< endl;
			it->second.Display();
	}

	cout << endl << "Number of molecules: " << molecules.size() << endl;
}